

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::MonthOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  int iVar2;
  long *plVar3;
  int *piVar4;
  unsigned_long *puVar5;
  interval_t *piVar6;
  SelectionVector *sel_vector;
  VectorBuffer *pVVar7;
  idx_t iVar8;
  bool bVar9;
  optional_idx dict_size;
  UnifiedVectorFormat local_78;
  
  VVar1 = input->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    plVar3 = (long *)result->data;
    piVar6 = (interval_t *)input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::MonthOperator>
              (piVar6,plVar3,count,&input->validity,&result->validity,dataptr,adds_nulls);
    return;
  }
  if (VVar1 != DICTIONARY_VECTOR) {
    if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      plVar3 = (long *)result->data;
      piVar4 = (int *)input->data;
      puVar5 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      iVar2 = *piVar4;
      *plVar3 = (long)(int)(iVar2 + (((uint)(iVar2 / 6 + (iVar2 >> 0x1f)) >> 1) - (iVar2 >> 0x1f)) *
                                    -0xc);
      return;
    }
    goto LAB_00f658f5;
  }
  if (errors != CANNOT_ERROR) goto LAB_00f658f5;
  DictionaryVector::VerifyDictionary(input);
  pVVar7 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->buffer);
  local_78.sel = (SelectionVector *)pVVar7[1].data.allocator.ptr;
  if (((Allocator *)local_78.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar8 = optional_idx::GetIndex((optional_idx *)&local_78), count < iVar8 * 2)) {
LAB_00f65b35:
    bVar9 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(input);
    pVVar7 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->auxiliary);
    bVar9 = *(char *)&pVVar7[1]._vptr_VectorBuffer == '\0';
    if (!bVar9) goto LAB_00f65b35;
    plVar3 = (long *)result->data;
    piVar6 = (interval_t *)pVVar7[1].data.pointer;
    iVar8 = optional_idx::GetIndex((optional_idx *)&local_78);
    FlatVector::VerifyFlatVector((Vector *)(pVVar7 + 1));
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::MonthOperator>
              (piVar6,plVar3,iVar8,(ValidityMask *)&pVVar7[1].data.allocated_size,&result->validity,
               dataptr,adds_nulls);
    DictionaryVector::VerifyDictionary(input);
    pVVar7 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->buffer);
    iVar8 = optional_idx::GetIndex((optional_idx *)&local_78);
    Vector::Dictionary(result,result,iVar8,(SelectionVector *)(pVVar7 + 1),count);
  }
  if (bVar9) {
    return;
  }
LAB_00f658f5:
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_78);
  Vector::SetVectorType(result,FLAT_VECTOR);
  sel_vector = local_78.sel;
  plVar3 = (long *)result->data;
  FlatVector::VerifyFlatVector(result);
  ExecuteLoop<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::MonthOperator>
            ((interval_t *)local_78.data,plVar3,count,sel_vector,&local_78.validity,
             &result->validity,dataptr,adds_nulls);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}